

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManPrintPackingStats(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  int nNumStr [5];
  uint local_48 [6];
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  pVVar4 = p->vPacking;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    return;
  }
  iVar1 = pVVar4->nSize;
  if (0 < iVar1) {
    puVar5 = (uint *)pVVar4->pArray;
    uVar2 = *puVar5;
    uVar6 = 0;
    if (iVar1 != 1) {
      uVar8 = 1;
      uVar6 = 0;
      do {
        if ((int)uVar8 < 0) goto LAB_0020db6a;
        uVar3 = puVar5[uVar8];
        if (2 < uVar3 - 1) {
          __assert_fail("Entry > 0 && Entry < 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x250,"void Gia_ManPrintPackingStats(Gia_Man_t *)");
        }
        local_48[uVar3] = local_48[uVar3] + 1;
        uVar8 = uVar8 + uVar3 + 1;
        uVar6 = uVar6 + 1;
      } while ((int)uVar8 < iVar1);
    }
    if (uVar2 == uVar6) {
      uVar7 = 3;
      if ((((int)local_48[3] < 1) && (uVar7 = 2, (int)local_48[2] < 1)) &&
         (uVar7 = 1, (int)local_48[1] < 1)) {
        uVar6 = 0;
        Abc_Print(1,"Packing (N=%d)  :  ",0xffffffff);
      }
      else {
        Abc_Print(1,"Packing (N=%d)  :  ",uVar7);
        uVar6 = 0;
        uVar9 = 1;
        do {
          uVar8 = local_48[uVar9];
          Abc_Print(1,"%d x LUT = %d   ",uVar9 & 0xffffffff,(ulong)uVar8);
          uVar6 = uVar6 + uVar8 * (int)uVar9;
          bVar10 = uVar9 != uVar7;
          uVar9 = uVar9 + 1;
        } while (bVar10);
      }
      Abc_Print(1,"Total = %d   ",(ulong)uVar2);
      Abc_Print(1,"Total LUT = %d",(ulong)uVar6);
      Abc_Print(1,"\n");
      return;
    }
    __assert_fail("nEntries == nEntries2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x25a,"void Gia_ManPrintPackingStats(Gia_Man_t *)");
  }
LAB_0020db6a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManPrintPackingStats( Gia_Man_t * p )
{
    int fVerbose = 0;
    int nObjToShow = 200;
    int nNumStr[5] = {0};
    int i, k, Entry, nEntries, nEntries2, MaxSize = -1, Count = 0;
    if ( p->vPacking == NULL )
        return;
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        nNumStr[Entry]++;
        i++;
        if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "{ " );
        for ( k = 0; k < Entry; k++, i++ )
            if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "%d ", Vec_IntEntry(p->vPacking, i) );
        if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "}\n" );
        i--;
        nEntries2++;
    }
    assert( nEntries == nEntries2 );
    if ( nNumStr[3] > 0 )
        MaxSize = 3;
    else if ( nNumStr[2] > 0 )
        MaxSize = 2;
    else if ( nNumStr[1] > 0 )
        MaxSize = 1;
    Abc_Print( 1, "Packing (N=%d)  :  ", MaxSize );
    for ( i = 1; i <= MaxSize; i++ )
    {
        Abc_Print( 1, "%d x LUT = %d   ", i, nNumStr[i] );
        Count += i * nNumStr[i];
    }
    Abc_Print( 1, "Total = %d   ", nEntries2 );
    Abc_Print( 1, "Total LUT = %d", Count );
    Abc_Print( 1, "\n" );
}